

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O2

Vec_Ptr_t * Saig_ManBmcTerSim(Aig_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  uint *pInfo;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  p_00 = Vec_PtrAlloc(100);
  uVar2 = 0;
  pInfo = (uint *)0x0;
  uVar3 = 0;
  iVar4 = 1000000000;
  while (((0 < iVar4 && (uVar2 < 1000)) && (uVar3 < 5))) {
    iVar1 = Saig_ManBmcTerSimCount01(p,pInfo);
    pInfo = Saig_ManBmcTerSimOne(p,pInfo);
    Vec_PtrPush(p_00,pInfo);
    uVar2 = uVar2 + 1;
    uVar3 = uVar3 + (iVar4 <= iVar1);
    iVar4 = iVar1;
  }
  return p_00;
}

Assistant:

Vec_Ptr_t * Saig_ManBmcTerSim( Aig_Man_t * p )
{
    Vec_Ptr_t * vInfos;
    unsigned * pInfo = NULL;
    int i, TerPrev = ABC_INFINITY, TerCur, CountIncrease = 0;
    vInfos = Vec_PtrAlloc( 100 );
    for ( i = 0; i < 1000 && CountIncrease < 5 && TerPrev > 0; i++ )
    {
        TerCur = Saig_ManBmcTerSimCount01( p, pInfo );
        if ( TerCur >= TerPrev )
            CountIncrease++;
        TerPrev = TerCur;
        pInfo = Saig_ManBmcTerSimOne( p, pInfo );
        Vec_PtrPush( vInfos, pInfo );
    }
    return vInfos;
}